

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<cs::numeric>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::numeric> *this)

{
  longdouble lVar1;
  stringstream ss;
  char *local_1c0;
  size_type local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  stringstream local_1a0 [16];
  long local_190;
  long alStack_188 [46];
  
  if ((this->mDat).type == false) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    local_1b8 = 0;
    local_1b0 = '\0';
    *(long *)((long)alStack_188 + *(long *)(local_190 + -0x18)) =
         (long)*(int *)(cs::current_process + 0x50);
    lVar1 = *(longdouble *)&(this->mDat).data;
    if ((this->mDat).type != false) {
      lVar1 = (longdouble)(this->mDat).data._int;
    }
    local_1c0 = &local_1b0;
    std::ostream::_M_insert<long_double>(lVar1);
    std::operator>>((istream *)local_1a0,(string *)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_1c0 == &local_1b0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_1c0;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1af,local_1b0);
    }
    __return_storage_ptr__->_M_string_length = local_1b8;
    local_1b8 = 0;
    local_1b0 = '\0';
    local_1c0 = &local_1b0;
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  else {
    std::__cxx11::to_string(__return_storage_ptr__,(this->mDat).data._int);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}